

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O1

void __thiscall RenX::Server::sendPubChan(Server *this,string_view msg)

{
  size_type __len2;
  long lVar1;
  undefined8 uVar2;
  size_type __n;
  size_t i;
  long lVar3;
  string_view sVar4;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __n = msg._M_len;
  sVar4 = getPrefix(this);
  __len2 = sVar4._M_len;
  if (__len2 == 0) {
    lVar3 = ServerManager::size();
    if (lVar3 != 0) {
      lVar3 = 0;
      do {
        uVar2 = ServerManager::getServer(_serverManager);
        Jupiter::IRC::Client::messageChannels(uVar2,this->m_logChanType,__n,msg._M_str);
        lVar3 = lVar3 + 1;
        lVar1 = ServerManager::size();
      } while (lVar3 != lVar1);
    }
  }
  else {
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              (&local_50,__n + __len2 + 1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_50,0,local_50._M_string_length,sVar4._M_str,__len2);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_50,' ');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_50,msg._M_str,__n);
    lVar3 = 0;
    while( true ) {
      lVar1 = ServerManager::size();
      if (lVar3 == lVar1) break;
      uVar2 = ServerManager::getServer(_serverManager);
      Jupiter::IRC::Client::messageChannels
                (uVar2,this->m_logChanType,local_50._M_string_length,local_50._M_dataplus._M_p);
      lVar3 = lVar3 + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void RenX::Server::sendPubChan(std::string_view msg) const {
	std::string_view prefix = getPrefix();
	if (!prefix.empty()) {
		std::string message;
		message.reserve(msg.size() + prefix.size() + 1);
		message = prefix;
		message += ' ';
		message += msg;
		for (size_t i = 0; i != serverManager->size(); i++) {
			serverManager->getServer(i)->messageChannels(m_logChanType, message);
		}

		return;
	}

	for (size_t i = 0; i != serverManager->size(); i++) {
		serverManager->getServer(i)->messageChannels(m_logChanType, msg);
	}
}